

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

int anon_unknown.dwarf_116269::rename_noreplace(czstring old_path,czstring new_path)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  int err;
  long ret_val;
  czstring pcStack_20;
  anon_class_1_0_00000001 is_unavailable;
  czstring new_path_local;
  czstring old_path_local;
  
  pcStack_20 = new_path;
  lVar3 = syscall(0x13c,0xffffff9c,old_path,0xffffff9c,new_path,1);
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  if (lVar3 < 0) {
    bVar1 = rename_noreplace::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&ret_val + 7),iVar2);
    if (bVar1) {
      iVar2 = linkat(-100,old_path,-100,pcStack_20,0);
      if (iVar2 < 0) {
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        bVar1 = rename_noreplace::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&ret_val + 7),iVar2);
        if ((bVar1) || (iVar2 == 1)) {
          iVar2 = faccessat(-100,pcStack_20,0,0x100);
          if (iVar2 < 0) {
            piVar4 = __errno_location();
            if (*piVar4 == 2) {
              iVar2 = renameat(-100,old_path,-100,pcStack_20);
              if (iVar2 < 0) {
                piVar4 = __errno_location();
                old_path_local._4_4_ = -*piVar4;
              }
              else {
                old_path_local._4_4_ = 0;
              }
            }
            else {
              piVar4 = __errno_location();
              old_path_local._4_4_ = -*piVar4;
            }
          }
          else {
            old_path_local._4_4_ = -0x11;
          }
        }
        else {
          old_path_local._4_4_ = -iVar2;
        }
      }
      else {
        iVar2 = unlinkat(-100,old_path,0);
        if (iVar2 < 0) {
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          unlinkat(-100,pcStack_20,0);
          old_path_local._4_4_ = -iVar2;
        }
        else {
          old_path_local._4_4_ = 0;
        }
      }
    }
    else {
      old_path_local._4_4_ = -iVar2;
    }
  }
  else {
    old_path_local._4_4_ = 0;
  }
  return old_path_local._4_4_;
}

Assistant:

int rename_noreplace (pstore::gsl::czstring const old_path,
                          pstore::gsl::czstring const new_path) {
        auto const is_unavailable = [] (int const e) noexcept {
            return e == EINVAL || errno == ENOSYS || errno == ENOTTY;
        };

        auto ret_val = -1L;
        auto err = EINVAL;
        // Try the preferred function first which could come in any one of three forms:
        // - The macOS renamex_np() function.
        // - If available, the glibc wrapper around the Linux renameat2() function.
        // - A direct call to the Linux renameat2 syscall.
#    if defined(PSTORE_HAVE_RENAMEX_NP)
        ret_val = ::renamex_np (old_path, new_path, RENAME_EXCL);
        err = errno;
#    elif defined(PSTORE_HAVE_RENAMEAT2)
        ret_val = ::renameat2 (AT_FDCWD, old_path, AT_FDCWD, new_path, RENAME_NOREPLACE);
        err = errno;
#    elif defined(PSTORE_HAVE_SYS_renameat2)
        // Support for renameat2() was added in glibc 2.28. If we have an older version, we have
        // to invoke the syscall dfirectly.
        ret_val =
            ::syscall (SYS_renameat2, AT_FDCWD, old_path, AT_FDCWD, new_path, RENAME_NOREPLACE);
        err = errno;
#    else
        // A platform with no renameat2() equivalent that we know about.
        ret_val = -1;
        err = EINVAL;
#    endif
        if (ret_val >= 0) {
            return 0;
        }
        // Apple added renamex_np() for APFS; renameat2() was added in Linux 3.15, but some file
        // systems added support later. If our first try involved an unsupported API, we need to use
        // a fall-back implementation.
        if (!is_unavailable (err)) {
            return -err;
        }

        // Use linkat()/unlinkat() as our first fallback. This doesn't work on directories and on
        // some file systems that do not support hard links (such as FAT).
        if (::linkat (AT_FDCWD, old_path, AT_FDCWD, new_path, 0) >= 0) {
            if (::unlinkat (AT_FDCWD, old_path, 0) < 0) {
                err = errno; // Save errno before unlinkat() clobbers it.
                (void) ::unlinkat (AT_FDCWD, new_path, 0);
                return -err;
            }
            return 0;
        }
        err = errno;
        if (!is_unavailable (err) && err != EPERM) { // FAT returns EPERM on link()
            return -err;
        }

        // Neither renameat2() nor linkat()/unlinkat() worked. Fallback to the TOCTOU vulnerable
        // accessat(F_OK) check followed by classic, replacing renameat(), we have nothing better.
        if (::faccessat (AT_FDCWD, new_path, F_OK, AT_SYMLINK_NOFOLLOW) >= 0) {
            return -EEXIST;
        }
        if (errno != ENOENT) {
            return -errno;
        }
        if (::renameat (AT_FDCWD, old_path, AT_FDCWD, new_path) < 0) {
            return -errno;
        }
        return 0;
    }